

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDataStream.h
# Opt level: O1

void __thiscall KDIS::KDataStream::Read<short>(KDataStream *this,short *T)

{
  pointer puVar1;
  NetToDataType<short> *pNVar2;
  ushort uVar3;
  long lVar4;
  NetToDataType<short> OctArray;
  KOCTET Temp [2];
  
  OctArray.m_Value = *T;
  puVar1 = (this->m_vBuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar3 = this->m_ui16CurrentWritePos;
  lVar4 = -1;
  do {
    Temp[lVar4 + -1] = puVar1[uVar3];
    uVar3 = uVar3 + 1;
    this->m_ui16CurrentWritePos = uVar3;
    lVar4 = lVar4 + 1;
  } while (lVar4 == 0);
  if (this->m_MachineEndian != this->m_NetEndian) {
    pNVar2 = &OctArray;
    Temp = (KOCTET  [2])OctArray;
    lVar4 = 1;
    do {
      (pNVar2->field_0).m_Octs[0] = Temp[lVar4];
      pNVar2 = (NetToDataType<short> *)((pNVar2->field_0).m_Octs + 1);
      lVar4 = lVar4 + -1;
    } while (lVar4 == 0);
  }
  *T = (short)OctArray;
  return;
}

Assistant:

void KDataStream::Read( Type & T )
{
    NetToDataType<Type> OctArray( T, false );

    // Copy octets into data type
    for( KUINT8 i = 0; i < sizeof T; ++i, ++m_ui16CurrentWritePos )
    {
        OctArray.m_Octs[i] = m_vBuffer[m_ui16CurrentWritePos];
    }

    if( m_MachineEndian != m_NetEndian )
    {
        OctArray.SwapBytes();
    }

    T = OctArray.m_Value;
}